

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O0

QDate QDate::fromString(QStringView string,DateFormat format)

{
  QStringView monthName;
  QStringView text;
  QStringView text_00;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  QStringView *pQVar4;
  qsizetype qVar5;
  int in_EDX;
  storage_type_conflict *in_RSI;
  qsizetype in_RDI;
  long in_FS_OFFSET;
  QStringView QVar6;
  int month;
  int day;
  int year;
  int i;
  ParsedInt day_1;
  ParsedInt month_1;
  ParsedInt year_1;
  bool ok;
  iterator it;
  TokenizerResult<const_QStringView_&,_char16_t> tokens;
  QVarLengthArray<QStringView,_4LL> parts;
  undefined4 in_stack_fffffffffffffdf8;
  int in_stack_fffffffffffffdfc;
  undefined4 in_stack_fffffffffffffe00;
  SplitBehaviorFlags in_stack_fffffffffffffe04;
  QStringView *in_stack_fffffffffffffe08;
  undefined2 in_stack_fffffffffffffe10;
  byte in_stack_fffffffffffffe12;
  undefined1 in_stack_fffffffffffffe13;
  byte bVar7;
  undefined4 in_stack_fffffffffffffe14;
  qsizetype in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  bool local_1b5;
  storage_type_conflict *psVar8;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  int local_158;
  ParsedInt local_150;
  ParsedInt local_140;
  ParsedInt local_130;
  char16_t local_11e;
  char16_t local_11c;
  char16_t local_11a;
  qsizetype local_118;
  storage_type_conflict *psStack_110;
  byte local_f9;
  undefined1 local_f8 [62];
  undefined2 local_ba;
  qsizetype local_b8;
  storage_type_conflict *local_b0;
  ParsedRfcDateTime local_a8;
  QStringView local_98;
  qint64 local_88;
  undefined1 local_80 [32];
  QVarLengthArray<QStringView,_4LL> local_60;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_98.m_size = in_RDI;
  local_98.m_data = in_RSI;
  bVar1 = QStringView::isEmpty((QStringView *)0x569c60);
  if (bVar1) {
    QDate((QDate *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
    goto LAB_0056a2eb;
  }
  if (in_EDX != 0) {
    if (in_EDX == 1) {
      qVar5 = QStringView::size(&local_98);
      bVar7 = 0;
      if (9 < qVar5) {
        local_11a = (char16_t)
                    QStringView::operator[]
                              (in_stack_fffffffffffffe08,
                               CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
        bVar1 = QChar::isPunct((QChar *)0x56a09a);
        bVar7 = 0;
        if (bVar1) {
          local_11c = (char16_t)
                      QStringView::operator[]
                                (in_stack_fffffffffffffe08,
                                 CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
          bVar1 = QChar::isPunct((QChar *)0x56a0d3);
          bVar7 = 0;
          if (bVar1) {
            qVar5 = QStringView::size(&local_98);
            in_stack_fffffffffffffe12 = 1;
            bVar7 = in_stack_fffffffffffffe12;
            if (qVar5 != 10) {
              local_11e = (char16_t)
                          QStringView::operator[]
                                    (in_stack_fffffffffffffe08,
                                     CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
              bVar1 = QChar::isDigit((QChar *)0x56a125);
              in_stack_fffffffffffffe12 = bVar1 ^ 0xff;
              bVar7 = in_stack_fffffffffffffe12;
            }
          }
        }
      }
      if ((bVar7 & 1) != 0) {
        local_130.used = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_130.result = (unsigned_long_long)&DAT_aaaaaaaaaaaaaaaa;
        QVar6 = QStringView::first((QStringView *)
                                   CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                                   0x56a170);
        psVar8 = QVar6.m_data;
        QVar6.m_data._0_4_ = in_stack_fffffffffffffe80;
        QVar6.m_size = (qsizetype)psVar8;
        QVar6.m_data._4_4_ = in_stack_fffffffffffffe84;
        local_130 = anon_unknown.dwarf_ba72a6::readInt(QVar6);
        local_140.used = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_140.result = (unsigned_long_long)&DAT_aaaaaaaaaaaaaaaa;
        QStringView::sliced((QStringView *)
                            CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                            in_stack_fffffffffffffe18,
                            CONCAT44(in_stack_fffffffffffffe14,
                                     CONCAT13(bVar7,CONCAT12(in_stack_fffffffffffffe12,
                                                             in_stack_fffffffffffffe10))));
        text.m_data._0_4_ = in_stack_fffffffffffffe80;
        text.m_size = (qsizetype)psVar8;
        text.m_data._4_4_ = in_stack_fffffffffffffe84;
        local_140 = anon_unknown.dwarf_ba72a6::readInt(text);
        local_150.used = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_150.result = (unsigned_long_long)&DAT_aaaaaaaaaaaaaaaa;
        QStringView::sliced((QStringView *)
                            CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                            in_stack_fffffffffffffe18,
                            CONCAT44(in_stack_fffffffffffffe14,
                                     CONCAT13(bVar7,CONCAT12(in_stack_fffffffffffffe12,
                                                             in_stack_fffffffffffffe10))));
        text_00.m_data._0_4_ = in_stack_fffffffffffffe80;
        text_00.m_size = (qsizetype)psVar8;
        text_00.m_data._4_4_ = in_stack_fffffffffffffe84;
        local_150 = anon_unknown.dwarf_ba72a6::readInt(text_00);
        bVar1 = QSimpleParsedNumber<unsigned_long_long>::ok(&local_130);
        if ((((bVar1) && (local_130.result != 0)) && (local_130.result < 10000)) &&
           ((bVar1 = QSimpleParsedNumber<unsigned_long_long>::ok(&local_140), bVar1 &&
            (bVar1 = QSimpleParsedNumber<unsigned_long_long>::ok(&local_150), bVar1)))) {
          QDate((QDate *)CONCAT44(in_stack_fffffffffffffe14,
                                  CONCAT13(bVar7,CONCAT12(in_stack_fffffffffffffe12,
                                                          in_stack_fffffffffffffe10))),
                (int)((ulong)in_stack_fffffffffffffe08 >> 0x20),(int)in_stack_fffffffffffffe08,
                in_stack_fffffffffffffe04);
          goto LAB_0056a2eb;
        }
      }
      QDate((QDate *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
      goto LAB_0056a2eb;
    }
    if (in_EDX == 8) {
      local_b8 = local_98.m_size;
      local_b0 = local_98.m_data;
      local_a8 = rfcDateImpl((QStringView)month_1);
      local_88 = local_a8.date.jd;
      goto LAB_0056a2eb;
    }
  }
  memset(&local_60,0xaa,0x58);
  QVarLengthArray<QStringView,_4LL>::QVarLengthArray(&local_60);
  local_80._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_80._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_80._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_80._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_ba = 0x20;
  QStringView::tokenize<char16_t,Qt::SplitBehaviorFlags>
            ((QStringView *)
             CONCAT44(in_stack_fffffffffffffe14,
                      CONCAT13(in_stack_fffffffffffffe13,
                               CONCAT12(in_stack_fffffffffffffe12,in_stack_fffffffffffffe10))),
             (char16_t *)in_stack_fffffffffffffe08,in_stack_fffffffffffffe04);
  memset(local_f8,0xaa,0x38);
  QStringTokenizerBase<QStringView,_QChar>::begin
            ((QStringTokenizerBase<QStringView,_QChar> *)
             CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  local_158 = 0;
  while( true ) {
    local_1b5 = false;
    if (local_158 < 4) {
      QStringTokenizerBase<QStringView,_QChar>::end
                ((QStringTokenizerBase<QStringView,_QChar> *)local_80);
      local_1b5 = ::operator!=(local_f8);
    }
    if (local_1b5 == false) break;
    QStringTokenizerBase<QStringView,_QChar>::iterator::operator*((iterator *)0x569e07);
    QVarLengthArray<QStringView,4ll>::emplace_back<QStringView_const&>
              ((QVarLengthArray<QStringView,_4LL> *)
               CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
               (QStringView *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    local_158 = local_158 + 1;
    QStringTokenizerBase<QStringView,_QChar>::iterator::operator++
              ((iterator *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  }
  sVar3 = QVLABaseBase::size((QVLABaseBase *)&local_60);
  if (sVar3 == 4) {
    QStringTokenizerBase<QStringView,_QChar>::end
              ((QStringTokenizerBase<QStringView,_QChar> *)local_80);
    bVar1 = ::operator!=(local_f8);
    if (bVar1) goto LAB_00569ea5;
    local_f9 = 0;
    QVarLengthArray<QStringView,_4LL>::at
              ((QVarLengthArray<QStringView,_4LL> *)
               CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
               CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    QStringView::toInt(in_stack_fffffffffffffe08,
                       (bool *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                       in_stack_fffffffffffffdfc);
    if ((local_f9 & 1) == 0) {
      iVar2 = 0;
    }
    else {
      QVarLengthArray<QStringView,_4LL>::at
                ((QVarLengthArray<QStringView,_4LL> *)
                 CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                 CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      iVar2 = QStringView::toInt(in_stack_fffffffffffffe08,
                                 (bool *)CONCAT44(in_stack_fffffffffffffe04,
                                                  in_stack_fffffffffffffe00),
                                 in_stack_fffffffffffffdfc);
    }
    if (((local_f9 & 1) == 0) || (iVar2 == 0)) {
      QDate((QDate *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
    }
    else {
      pQVar4 = QVarLengthArray<QStringView,_4LL>::at
                         ((QVarLengthArray<QStringView,_4LL> *)
                          CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                          CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      local_118 = pQVar4->m_size;
      psStack_110 = pQVar4->m_data;
      monthName.m_size._2_1_ = in_stack_fffffffffffffe12;
      monthName.m_size._0_2_ = in_stack_fffffffffffffe10;
      monthName.m_size._3_1_ = in_stack_fffffffffffffe13;
      monthName.m_size._4_4_ = in_stack_fffffffffffffe14;
      monthName.m_data = (storage_type_conflict *)pQVar4;
      iVar2 = fromShortMonthName(monthName);
      if (iVar2 == -1) {
        QDate((QDate *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
      }
      else {
        QDate((QDate *)CONCAT44(iVar2,CONCAT13(in_stack_fffffffffffffe13,
                                               CONCAT12(in_stack_fffffffffffffe12,
                                                        in_stack_fffffffffffffe10))),
              (int)((ulong)in_stack_fffffffffffffe08 >> 0x20),(int)in_stack_fffffffffffffe08,
              in_stack_fffffffffffffe04);
      }
    }
  }
  else {
LAB_00569ea5:
    QDate((QDate *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  }
  QVarLengthArray<QStringView,_4LL>::~QVarLengthArray
            ((QVarLengthArray<QStringView,_4LL> *)
             CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
LAB_0056a2eb:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QDate)local_88;
}

Assistant:

QDate QDate::fromString(QStringView string, Qt::DateFormat format)
{
    if (string.isEmpty())
        return QDate();

    switch (format) {
    case Qt::RFC2822Date:
        return rfcDateImpl(string).date;
    default:
    case Qt::TextDate: {
        // Documented as "ddd MMM d yyyy"
        QVarLengthArray<QStringView, 4> parts;
        auto tokens = string.tokenize(u' ', Qt::SkipEmptyParts);
        auto it = tokens.begin();
        for (int i = 0; i < 4 && it != tokens.end(); ++i, ++it)
            parts.emplace_back(*it);

        if (parts.size() != 4 || it != tokens.end())
            return QDate();

        bool ok = false;
        int year = parts.at(3).toInt(&ok);
        int day = ok ? parts.at(2).toInt(&ok) : 0;
        if (!ok || !day)
            return QDate();

        const int month = fromShortMonthName(parts.at(1));
        if (month == -1) // Month name matches no English or localised name.
            return QDate();

        return QDate(year, month, day);
        }
    case Qt::ISODate:
        // Semi-strict parsing, must be long enough and have punctuators as separators
        if (string.size() >= 10 && string[4].isPunct() && string[7].isPunct()
                && (string.size() == 10 || !string[10].isDigit())) {
            const ParsedInt year = readInt(string.first(4));
            const ParsedInt month = readInt(string.sliced(5, 2));
            const ParsedInt day = readInt(string.sliced(8, 2));
            if (year.ok() && year.result > 0 && year.result <= 9999 && month.ok() && day.ok())
                return QDate(year.result, month.result, day.result);
        }
        break;
    }
    return QDate();
}